

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O0

BasicValue *
cvm::Ncurses::CursSet
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  bool bVar1;
  int I;
  reference this;
  undefined1 local_29;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args_local;
  
  bVar1 = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::empty(Args);
  if (bVar1) {
    local_29 = false;
  }
  else {
    this = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::front(Args);
    local_29 = BasicValue::toBool(this);
  }
  I = curs_set(local_29);
  BasicValue::BasicValue(__return_storage_ptr__,I);
  return __return_storage_ptr__;
}

Assistant:

BasicValue Ncurses::CursSet(std::list<BasicValue> &Args) {
  return ::curs_set(Args.empty() ? false : Args.front().toBool());
}